

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

optional<long> __thiscall
anon_unknown.dwarf_3ed9ed6::MultiADescriptor::ScriptSize(MultiADescriptor *this)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  undefined8 extraout_RDX;
  long in_FS_OFFSET;
  optional<long> oVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = (this->super_DescriptorImpl).m_pubkey_args.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->super_DescriptorImpl).m_pubkey_args.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  BuildScript<int_const&>((CScript *)&local_40,&this->m_threshold);
  uVar3 = local_40._size - 0x1d;
  if (local_40._size < 0x1d) {
    uVar3 = local_40._size;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = ((long)puVar1 - (long)puVar2 >> 3) * 0x22 + (ulong)uVar3 + 1;
    oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = (undefined7)((ulong)extraout_RDX >> 8);
    oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = true;
    return (optional<long>)
           oVar4.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> ScriptSize() const override {
        const auto n_keys = m_pubkey_args.size();
        return (1 + 32 + 1) * n_keys + BuildScript(m_threshold).size() + 1;
    }